

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool __thiscall QWidgetPrivate::isFocusChainConsistent(QWidgetPrivate *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  anon_union_4_2_7218e939_for_QLoggingCategory_2 aVar5;
  QDebug *pQVar6;
  long lVar7;
  QDebug debug;
  bool bVar8;
  ulong uVar9;
  QWidget *widget;
  QWidget *widget_00;
  QWidget *widget_01;
  long in_FS_OFFSET;
  Stream *local_c0;
  Stream *local_b8;
  Stream *local_b0;
  Stream *local_a8;
  QWidgetData *local_a0;
  Stream local_98 [8];
  QDebug local_90;
  QWidgetData *local_88;
  QDebug local_80;
  Stream *local_78;
  QDebug local_70;
  QWidgetData *local_68;
  Stream local_60 [8];
  QLoggingCategory local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  QLoggingCategory::QLoggingCategory(&local_58,"qt.widgets.focus",QtDebugMsg);
  aVar5 = local_58.field_2;
  QLoggingCategory::~QLoggingCategory(&local_58);
  bVar8 = true;
  if (((uint)aVar5 & 1) != 0) {
    lVar7 = *(long *)&this->field_0x8;
    if ((*(long *)(*(long *)(lVar7 + 8) + 0x80) != lVar7) ||
       (*(long *)(*(long *)(lVar7 + 8) + 0x88) != lVar7)) {
      uVar9 = 0xffffffffffffffff;
      lVar7 = lVar1;
      do {
        QApplication::allWidgets();
        uVar4 = CONCAT44(local_58.placeholder,local_58.field_2);
        QArrayDataPointer<QWidget_*>::~QArrayDataPointer((QArrayDataPointer<QWidget_*> *)&local_58);
        uVar9 = uVar9 + 1;
        if (uVar4 <= uVar9) {
          lcWidgetFocus();
          if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
              != 0) {
            local_58.d._0_1_ = (QPaintDevice)0x2;
            local_58.d._1_3_ = 0;
            local_58._4_8_ = 0;
            local_58.name._4_4_ = 0;
            local_58.field_2 = (anon_union_4_2_7218e939_for_QLoggingCategory_2)0x0;
            local_58.placeholder[0] = false;
            local_58.placeholder[1] = false;
            local_58.placeholder[2] = false;
            local_58.placeholder[3] = false;
            local_40 = lcWidgetFocus::category.name;
            QMessageLogger::debug();
            pQVar6 = QDebug::operator<<(&local_90,"Focus chain leading from");
            local_c0 = pQVar6->stream;
            *(int *)(local_c0 + 0x28) = *(int *)(local_c0 + 0x28) + 1;
            ::operator<<((Stream *)&local_80,(QWidget *)&local_c0);
            pQVar6 = QDebug::operator<<(&local_80,"to");
            local_b8 = pQVar6->stream;
            *(int *)(local_b8 + 0x28) = *(int *)(local_b8 + 0x28) + 1;
            ::operator<<((Stream *)&local_70,(QWidget *)&local_b8);
            QDebug::operator<<(&local_70,"is not closed.");
            QDebug::~QDebug(&local_70);
            QDebug::~QDebug((QDebug *)&local_b8);
            QDebug::~QDebug(&local_80);
            QDebug::~QDebug((QDebug *)&local_c0);
LAB_00303ab7:
            QDebug::~QDebug(&local_90);
          }
LAB_00303abc:
          bVar8 = false;
          break;
        }
        lVar2 = *(long *)(*(long *)(lVar7 + 8) + 0x88);
        if ((lVar2 == 0) || (lVar3 = *(long *)(*(long *)(lVar7 + 8) + 0x80), lVar3 == 0)) {
          lcWidgetFocus();
          if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
              != 0) {
            local_58.d._0_1_ = (QPaintDevice)0x2;
            local_58.d._1_3_ = 0;
            local_58._4_8_ = 0;
            local_58.name._4_4_ = 0;
            local_58.field_2 = (anon_union_4_2_7218e939_for_QLoggingCategory_2)0x0;
            local_58.placeholder[0] = false;
            local_58.placeholder[1] = false;
            local_58.placeholder[2] = false;
            local_58.placeholder[3] = false;
            local_40 = lcWidgetFocus::category.name;
            QMessageLogger::debug();
            pQVar6 = QDebug::operator<<(&local_90,"Nullptr found at:");
            local_88 = (QWidgetData *)pQVar6->stream;
            widget_01 = (QWidget *)&local_88;
            *(int *)&(local_88->pal).d = *(int *)&(local_88->pal).d + 1;
            ::operator<<((Stream *)&local_80,widget_01);
            pQVar6 = QDebug::operator<<(&local_80,"Previous pointing to");
            local_78 = pQVar6->stream;
            widget = (QWidget *)&local_78;
            *(int *)(local_78 + 0x28) = *(int *)(local_78 + 0x28) + 1;
            ::operator<<((Stream *)&local_70,widget);
            pQVar6 = QDebug::operator<<(&local_70,"Next pointing to");
            local_68 = (QWidgetData *)pQVar6->stream;
            widget_00 = (QWidget *)&local_68;
            *(int *)&(local_68->pal).d = *(int *)&(local_68->pal).d + 1;
            debug.stream = local_60;
LAB_0030399e:
            ::operator<<(debug,widget_00);
            QDebug::~QDebug((QDebug *)debug.stream);
            QDebug::~QDebug((QDebug *)widget_00);
            QDebug::~QDebug(&local_70);
            QDebug::~QDebug((QDebug *)widget);
            QDebug::~QDebug(&local_80);
            QDebug::~QDebug((QDebug *)widget_01);
            goto LAB_00303ab7;
          }
          goto LAB_00303abc;
        }
        if ((*(long *)(*(long *)(lVar3 + 8) + 0x88) != lVar7) ||
           (*(long *)(*(long *)(lVar2 + 8) + 0x80) != lVar7)) {
          lcWidgetFocus();
          if (((byte)lcWidgetFocus::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
              != 0) {
            local_58.d._0_1_ = (QPaintDevice)0x2;
            local_58.d._1_3_ = 0;
            local_58._4_8_ = 0;
            local_58.name._4_4_ = 0;
            local_58.field_2 = (anon_union_4_2_7218e939_for_QLoggingCategory_2)0x0;
            local_58.placeholder[0] = false;
            local_58.placeholder[1] = false;
            local_58.placeholder[2] = false;
            local_58.placeholder[3] = false;
            local_40 = lcWidgetFocus::category.name;
            QMessageLogger::debug();
            pQVar6 = QDebug::operator<<(&local_90,"Inconsistent focus chain at:");
            local_b0 = pQVar6->stream;
            widget_01 = (QWidget *)&local_b0;
            *(int *)(local_b0 + 0x28) = *(int *)(local_b0 + 0x28) + 1;
            ::operator<<((Stream *)&local_80,widget_01);
            pQVar6 = QDebug::operator<<(&local_80,"Previous pointing to");
            local_a8 = pQVar6->stream;
            widget = (QWidget *)&local_a8;
            *(int *)(local_a8 + 0x28) = *(int *)(local_a8 + 0x28) + 1;
            ::operator<<((Stream *)&local_70,widget);
            pQVar6 = QDebug::operator<<(&local_70,"Next pointing to");
            local_a0 = (QWidgetData *)pQVar6->stream;
            widget_00 = (QWidget *)&local_a0;
            *(int *)&(local_a0->pal).d = *(int *)&(local_a0->pal).d + 1;
            debug.stream = local_98;
            goto LAB_0030399e;
          }
          goto LAB_00303abc;
        }
        lVar7 = lVar3;
      } while (lVar3 != lVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QWidgetPrivate::isFocusChainConsistent() const
{
    Q_Q(const QWidget);
    const bool skip = !QLoggingCategory("qt.widgets.focus").isDebugEnabled();
    if (skip)
        return true;

    if (!isInFocusChain())
        return true;

    const QWidget *position = q;

    for (int i = 0; i < QApplication::allWidgets().count(); ++i) {
        if (!FOCUS_PREV(position) || !FOCUS_NEXT(position)) {
            qCDebug(lcWidgetFocus) << "Nullptr found at:" << position
                             << "Previous pointing to" << FOCUS_PREV(position)
                             << "Next pointing to" << FOCUS_NEXT(position);
            return false;
        }
        if (!(FOCUS_PREV(FOCUS_NEXT(position)) == position
            && FOCUS_NEXT(FOCUS_PREV(position)) == position)) {
            qCDebug(lcWidgetFocus) << "Inconsistent focus chain at:" << position
                             << "Previous pointing to" << FOCUS_PREV(FOCUS_NEXT(position))
                             << "Next pointing to" << FOCUS_NEXT(FOCUS_PREV(position));
            return false;
        }
        position = FOCUS_NEXT(position);
        if (position == q)
            return true;

    }

    qCDebug(lcWidgetFocus) << "Focus chain leading from" << q << "to" << position << "is not closed.";
    return false;
}